

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

ChannelList *
Imf_3_4::channelInAllViews
          (ChannelList *__return_storage_ptr__,string *channelName,ChannelList *channelList,
          StringVector *multiView)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr __lhs;
  bool bVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  allocator<char> local_61;
  ChannelList *local_60;
  StringVector *local_58;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = __return_storage_ptr__;
  local_58 = multiView;
  cVar3._M_node = (_Base_ptr)ChannelList::begin(channelList);
  do {
    CVar4 = ChannelList::end(channelList);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
      return local_60;
    }
    __lhs = cVar3._M_node + 1;
    bVar2 = std::operator==((char *)__lhs,channelName);
    if (bVar2) {
LAB_0018edd2:
      ChannelList::insert(local_60,(char *)__lhs,(Channel *)(cVar3._M_node + 9));
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)__lhs,&local_61);
      bVar2 = areCounterparts(&local_50,channelName,local_58);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) goto LAB_0018edd2;
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  } while( true );
}

Assistant:

ChannelList
channelInAllViews (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Given the name of a channel, return a
    // list of the same channel in all views.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (i.name () == channelName ||
            areCounterparts (i.name (), channelName, multiView))
        {
            q.insert (i.name (), i.channel ());
        }
    }

    return q;
}